

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

char * TextSubtext(char *text,int position,int length)

{
  uint uVar1;
  int local_20;
  int c;
  int textLength;
  int length_local;
  int position_local;
  char *text_local;
  
  uVar1 = TextLength(text);
  c = length;
  textLength = position;
  if ((int)uVar1 <= position) {
    textLength = uVar1 - 1;
    c = 0;
  }
  if ((int)uVar1 <= c) {
    c = uVar1;
  }
  _length_local = text;
  for (local_20 = 0; local_20 < c; local_20 = local_20 + 1) {
    TextSubtext::buffer[local_20] = _length_local[textLength];
    _length_local = _length_local + 1;
  }
  TextSubtext::buffer[c] = '\0';
  return TextSubtext::buffer;
}

Assistant:

const char *TextSubtext(const char *text, int position, int length)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    int textLength = TextLength(text);

    if (position >= textLength)
    {
        position = textLength - 1;
        length = 0;
    }

    if (length >= textLength) length = textLength;

    for (int c = 0 ; c < length ; c++)
    {
        *(buffer + c) = *(text + position);
        text++;
    }

    *(buffer + length) = '\0';

    return buffer;
}